

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

Result __thiscall
presolve::HPresolve::removeDependentEquations(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  HPresolveAnalysis *this_00;
  _Rb_tree_header *p_Var1;
  bool bVar2;
  pointer pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  _Rb_tree_node_base *p_Var8;
  ulong uVar9;
  size_t __nbytes;
  ulong uVar10;
  void *__buf;
  void *__buf_00;
  size_type __n;
  uint uVar11;
  long lVar12;
  uint uVar13;
  int iVar17;
  double dVar14;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar18;
  int iVar19;
  int iVar22;
  undefined1 auVar21 [16];
  vector<int,_std::allocator<int>_> colSet;
  HighsSparseMatrix matrix;
  vector<int,_std::allocator<int>_> eqSet;
  HFactor factor;
  int local_87c;
  vector<int,_std::allocator<int>_> local_850;
  undefined1 local_838 [64];
  pointer local_7f8;
  iterator local_7f0;
  int *local_7e8;
  vector<double,_std::allocator<double>_> local_7e0;
  HighsPostsolveStack *local_7c8;
  vector<int,_std::allocator<int>_> local_7c0;
  undefined1 local_7a8 [16];
  HighsInt *local_798;
  HighsInt *pHStack_790;
  pointer piStack_788;
  pointer local_780;
  pointer piStack_778;
  pointer local_770;
  pointer piStack_768;
  pointer local_760;
  undefined1 uStack_758;
  undefined7 local_757;
  undefined1 uStack_750;
  undefined8 uStack_74f;
  pointer local_740;
  pointer piStack_738;
  pointer local_730;
  pointer piStack_728;
  pointer local_720;
  pointer piStack_718;
  pointer local_710;
  pointer pcStack_708;
  pointer local_700;
  undefined8 uStack_6f0;
  HighsInt HStack_6e8;
  HighsInt local_6e4;
  HighsInt HStack_6e0;
  undefined8 uStack_6dc;
  bool local_6c8;
  HighsInt *local_6c0;
  HighsInt *pHStack_6b8;
  double *local_6b0;
  HighsInt *pHStack_6a8;
  double local_6a0;
  double dStack_698;
  HighsInt local_690;
  double local_688;
  __uniq_ptr_impl<HFactor::LogData,_std::default_delete<HFactor::LogData>_> _Stack_680;
  FILE *local_678;
  bool *pbStack_670;
  bool *local_668;
  HighsInt *pHStack_660;
  _func_void_HighsLogType_char_ptr_void_ptr *local_658;
  void *pvStack_650;
  _Any_data local_648;
  _Manager_type p_Stack_638;
  undefined1 uStack_630;
  undefined7 local_62f;
  undefined1 uStack_628;
  undefined8 uStack_627;
  undefined2 local_618;
  undefined8 local_614;
  HighsTimer *local_608;
  HighsInt local_600;
  undefined1 local_5f8 [1312];
  pointer local_d8;
  pointer piStack_d0;
  pointer local_c8;
  pointer pdStack_c0;
  pointer local_b8;
  pointer pdStack_b0;
  pointer local_a0;
  pointer pcStack_98;
  pointer local_90;
  pointer piStack_88;
  pointer local_80;
  pointer piStack_78;
  pointer local_60;
  pointer piStack_58;
  pointer local_50;
  pointer pdStack_48;
  pointer local_40;
  pointer pdStack_38;
  undefined1 auVar20 [16];
  
  if ((this->equations)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    this_00 = &this->analysis_;
    bVar2 = (this->analysis_).logging_on_;
    local_7c8 = postsolve_stack;
    if (bVar2 != false) {
      HPresolveAnalysis::startPresolveRuleLog(this_00,10);
    }
    HighsSparseMatrix::HighsSparseMatrix((HighsSparseMatrix *)local_838);
    local_838._4_4_ = (undefined4)(this->equations)._M_t._M_impl.super__Rb_tree_header._M_node_count
    ;
    local_838._8_4_ = this->model->num_col_ + 1;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)(local_838 + 0x10),
               (long)(int)(local_838._4_4_ + 1));
    *(int *)local_838._16_8_ = 0;
    __n = (long)((int)((ulong)((long)(this->Avalue).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->Avalue).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3) -
                (int)((ulong)((long)(this->freeslots).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->freeslots).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2)) +
          (long)(int)local_838._4_4_;
    std::vector<double,_std::allocator<double>_>::reserve(&local_7e0,__n);
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)&local_7f8,__n);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_7c0,(long)(int)local_838._4_4_,(allocator_type *)local_7a8);
    p_Var8 = (this->equations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->equations)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var8 != p_Var1) {
      lVar12 = 0;
      do {
        iVar17 = *(int *)&p_Var8[1].field_0x4;
        local_7c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar12] = iVar17;
        iVar19 = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar17];
        if (iVar19 == -1) {
          piStack_788 = (pointer)0x0;
          local_780 = (pointer)0x0;
          local_798 = (HighsInt *)0x0;
          pHStack_790 = (HighsInt *)0x0;
          local_7a8._0_8_ = (int *)0x0;
          local_7a8._8_8_ = (double *)0x0;
          piStack_778 = (pointer)0x0;
          local_770 = (pointer)CONCAT44(local_770._4_4_,-1);
        }
        else {
          HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::iterator
                    ((iterator *)local_7a8,
                     (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,iVar19);
        }
        lVar12 = lVar12 + 1;
        while ((int)local_770 != -1) {
          local_850.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)local_7a8._8_8_;
          if (local_7e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_7e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (&local_7e0,
                       (iterator)
                       local_7e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,(double *)&local_850);
          }
          else {
            *local_7e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish =
                 (double)local_850.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
            local_7e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_7e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_850.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(local_850.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       *(int *)local_7a8._0_8_);
          if (local_7f0._M_current == local_7e8) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)&local_7f8,local_7f0,(int *)&local_850);
          }
          else {
            *local_7f0._M_current = *(int *)local_7a8._0_8_;
            local_7f0._M_current = local_7f0._M_current + 1;
          }
          HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++
                    ((iterator *)local_7a8);
        }
        if (piStack_788 != (pointer)0x0) {
          operator_delete(piStack_788);
        }
        pdVar3 = (this->model->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar14 = pdVar3[iVar17];
        if ((dVar14 != 0.0) || (NAN(dVar14))) {
          if (local_7e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_7e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_7e0,
                       (iterator)
                       local_7e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,pdVar3 + iVar17);
          }
          else {
            *local_7e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish = dVar14;
            local_7e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_7e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (local_7f0._M_current == local_7e8) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_7f8,local_7f0,
                       &this->model->num_col_);
          }
          else {
            *local_7f0._M_current = this->model->num_col_;
            local_7f0._M_current = local_7f0._M_current + 1;
          }
        }
        *(int *)(local_838._16_8_ + lVar12 * 4) =
             (int)((ulong)((long)local_7e0.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_7e0.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != p_Var1);
    }
    std::vector<int,_std::allocator<int>_>::vector
              (&local_850,(long)(int)local_838._4_4_,(allocator_type *)local_7a8);
    auVar6 = _DAT_003c57d0;
    auVar5 = _DAT_003c57c0;
    auVar4 = _DAT_003c57b0;
    if (local_850.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_850.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      uVar9 = (long)local_850.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish +
              (-4 - (long)local_850.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
      auVar21._8_4_ = (int)uVar9;
      auVar21._0_8_ = uVar9;
      auVar21._12_4_ = (int)(uVar9 >> 0x20);
      auVar16._0_8_ = uVar9 >> 2;
      auVar16._8_8_ = auVar21._8_8_ >> 2;
      uVar10 = 0;
      auVar16 = auVar16 ^ _DAT_003c57d0;
      do {
        iVar19 = (int)uVar10;
        auVar20._8_4_ = iVar19;
        auVar20._0_8_ = uVar10;
        auVar20._12_4_ = (int)(uVar10 >> 0x20);
        auVar21 = (auVar20 | auVar5) ^ auVar6;
        iVar17 = auVar16._4_4_;
        if ((bool)(~(auVar21._4_4_ == iVar17 && auVar16._0_4_ < auVar21._0_4_ ||
                    iVar17 < auVar21._4_4_) & 1)) {
          local_850.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar10] = iVar19;
        }
        if ((auVar21._12_4_ != auVar16._12_4_ || auVar21._8_4_ <= auVar16._8_4_) &&
            auVar21._12_4_ <= auVar16._12_4_) {
          local_850.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar10 + 1] = iVar19 + 1;
        }
        auVar21 = (auVar20 | auVar4) ^ auVar6;
        iVar22 = auVar21._4_4_;
        if (iVar22 <= iVar17 && (iVar22 != iVar17 || auVar21._0_4_ <= auVar16._0_4_)) {
          local_850.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar10 + 2] = iVar19 + 2;
          local_850.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar10 + 3] = iVar19 + 3;
        }
        uVar10 = uVar10 + 4;
      } while (((uVar9 >> 2) + 4 & 0xfffffffffffffffc) != uVar10);
    }
    local_710 = (pointer)0x0;
    pcStack_708 = (pointer)0x0;
    local_720 = (pointer)0x0;
    piStack_718 = (pointer)0x0;
    local_730 = (pointer)0x0;
    piStack_728 = (pointer)0x0;
    local_740 = (pointer)0x0;
    piStack_738 = (pointer)0x0;
    local_700 = (pointer)0x0;
    local_6c8 = false;
    local_618._0_1_ = false;
    local_618._1_1_ = false;
    local_614._0_4_ = 0;
    local_614._4_4_ = 0;
    local_608 = (HighsTimer *)0x0;
    local_600 = 0;
    local_d8 = (pointer)0x0;
    piStack_d0 = (pointer)0x0;
    local_c8 = (pointer)0x0;
    pdStack_c0 = (pointer)0x0;
    local_b8 = (pointer)0x0;
    pdStack_b0 = (pointer)0x0;
    local_a0 = (pointer)0x0;
    pcStack_98 = (pointer)0x0;
    local_90 = (pointer)0x0;
    piStack_88 = (pointer)0x0;
    local_80 = (pointer)0x0;
    piStack_78 = (pointer)0x0;
    local_40 = (pointer)0x0;
    pdStack_38 = (pointer)0x0;
    local_50 = (pointer)0x0;
    pdStack_48 = (pointer)0x0;
    local_60 = (pointer)0x0;
    piStack_58 = (pointer)0x0;
    local_798 = (HighsInt *)((ulong)local_798 & 0xffffffff00000000);
    local_7a8._0_8_ = (HighsInt *)0x0;
    local_7a8._8_8_ = (double *)0x0;
    uStack_750 = 0;
    uStack_74f = 0;
    local_760 = (pointer)0x0;
    uStack_758 = 0;
    local_757 = 0;
    local_770 = (pointer)0x0;
    piStack_768 = (pointer)0x0;
    local_780 = (pointer)0x0;
    piStack_778 = (pointer)0x0;
    pHStack_790 = (HighsInt *)0x0;
    piStack_788 = (pointer)0x0;
    HStack_6e0 = 0;
    uStack_6dc._0_4_ = 0;
    uStack_6dc._4_4_ = 0;
    uStack_6f0._0_4_ = 0;
    uStack_6f0._4_4_ = 0;
    HStack_6e8 = 0;
    local_6e4 = 0;
    local_690 = 0;
    local_6a0 = 0.0;
    dStack_698 = 0.0;
    local_6b0 = (double *)0x0;
    pHStack_6a8 = (HighsInt *)0x0;
    local_6c0 = (HighsInt *)0x0;
    pHStack_6b8 = (HighsInt *)0x0;
    uStack_628 = 0;
    uStack_627 = 0;
    p_Stack_638 = (_Manager_type)0x0;
    uStack_630 = 0;
    local_62f = 0;
    local_648._M_unused._M_object = (void *)0x0;
    local_648._8_8_ = 0;
    local_658 = (_func_void_HighsLogType_char_ptr_void_ptr *)0x0;
    pvStack_650 = (void *)0x0;
    local_668 = (bool *)0x0;
    pHStack_660 = (HighsInt *)0x0;
    local_678 = (FILE *)0x0;
    pbStack_670 = (bool *)0x0;
    local_688 = 0.0;
    _Stack_680._M_t.
    super__Tuple_impl<0UL,_HFactor::LogData_*,_std::default_delete<HFactor::LogData>_>.
    super__Head_base<0UL,_HFactor::LogData_*,_false>._M_head_impl =
         (tuple<HFactor::LogData_*,_std::default_delete<HFactor::LogData>_>)
         (_Tuple_impl<0UL,_HFactor::LogData_*,_std::default_delete<HFactor::LogData>_>)0x0;
    memset(local_5f8,0,0x518);
    HFactor::setup((HFactor *)local_7a8,(HighsSparseMatrix *)local_838,&local_850,0.1,1e-10,0,
                   (HighsLogOptions *)0x0);
    dVar18 = (this->options->super_HighsOptionsStruct).time_limit * 0.01;
    dVar14 = 1000.0;
    if (dVar18 <= 1000.0) {
      dVar14 = dVar18;
    }
    if (dVar14 <= 1.0) {
      dVar14 = 1.0;
    }
    HFactor::setTimeLimit((HFactor *)local_7a8,dVar14);
    __nbytes = (size_t)(uint)local_838._4_4_;
    highsLogUser(&(this->options->super_HighsOptionsStruct).log_options,kInfo,
                 "Dependent equations search running on %d equations with time limit of %.2fs\n",
                 dVar14);
    HighsTimer::read(this->timer,0,__buf,__nbytes);
    uVar7 = HFactor::build((HFactor *)local_7a8,(HighsTimerClock *)0x0);
    HighsTimer::read(this->timer,0,__buf_00,__nbytes);
    dVar18 = extraout_XMM0_Qa_00 - extraout_XMM0_Qa;
    if (uVar7 == 0xffffffff) {
      highsLogUser(&(this->options->super_HighsOptionsStruct).log_options,kInfo,
                   "Dependent equations search terminated after %.3gs due to expected time exceeding limit\n"
                   ,dVar18);
      (this->analysis_).logging_on_ = bVar2;
      if (bVar2 != false) {
        HPresolveAnalysis::stopPresolveRuleLog(this_00,0xb);
      }
    }
    else {
      dVar15 = (ABS(dVar18 - dVar14) * 100.0) / dVar14;
      if (dVar15 < 1.0) {
        highsLogUser(&(this->options->super_HighsOptionsStruct).log_options,kWarning,
                     "Dependent equations search finished within %.2f%% of limit of %.2fs: risk of non-deterministic behaviour if solve is repeated\n"
                     ,dVar15,dVar14);
      }
      if ((int)uVar7 < 1) {
        uVar13 = 0;
        uVar11 = 0;
        local_87c = 0;
      }
      else {
        uVar9 = 0;
        local_87c = 0;
        uVar11 = 0;
        uVar13 = 0;
        do {
          if ((long)local_760[uVar9] < 0) {
            local_87c = local_87c + 1;
          }
          else {
            iVar17 = local_7c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[local_760[uVar9]];
            iVar19 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar17];
            HighsPostsolveStack::redundantRow(local_7c8,iVar17);
            removeRow(this,iVar17);
            uVar11 = uVar11 + iVar19;
            uVar13 = uVar13 + 1;
          }
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      highsLogUser(&(this->options->super_HighsOptionsStruct).log_options,kInfo,
                   "Dependent equations search removed %d rows and %d nonzeros in %.2fs (limit = %.2fs)\n"
                   ,dVar18,dVar14,(ulong)uVar13,(ulong)uVar11);
      if (local_87c != 0) {
        highsLogDev(&(this->options->super_HighsOptionsStruct).log_options,kInfo,
                    ", avoiding %d fictitious rows");
      }
      highsLogDev(&(this->options->super_HighsOptionsStruct).log_options,kInfo,"\n");
      (this->analysis_).logging_on_ = bVar2;
      if (bVar2 != false) {
        HPresolveAnalysis::stopPresolveRuleLog(this_00,10);
      }
    }
    HFactor::~HFactor((HFactor *)local_7a8);
    if (local_850.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_850.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_7c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_7c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_7e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_7e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_7f8 != (pointer)0x0) {
      operator_delete(local_7f8);
    }
    if ((pointer)local_838._40_8_ != (pointer)0x0) {
      operator_delete((void *)local_838._40_8_);
    }
    if ((pointer)local_838._16_8_ != (pointer)0x0) {
      operator_delete((void *)local_838._16_8_);
    }
  }
  return kOk;
}

Assistant:

HPresolve::Result HPresolve::removeDependentEquations(
    HighsPostsolveStack& postsolve_stack) {
  assert(analysis_.allow_rule_[kPresolveRuleDependentEquations]);
  const bool logging_on = analysis_.logging_on_;
  if (equations.empty()) return Result::kOk;

  if (logging_on)
    analysis_.startPresolveRuleLog(kPresolveRuleDependentEquations);

  HighsSparseMatrix matrix;
  matrix.num_col_ = equations.size();
  matrix.num_row_ = model->num_col_ + 1;
  matrix.start_.resize(matrix.num_col_ + 1);
  matrix.start_[0] = 0;
  const HighsInt maxCapacity = numNonzeros() + matrix.num_col_;
  matrix.value_.reserve(maxCapacity);
  matrix.index_.reserve(maxCapacity);

  std::vector<HighsInt> eqSet(matrix.num_col_);
  HighsInt i = 0;
  for (const std::pair<HighsInt, HighsInt>& p : equations) {
    HighsInt eq = p.second;
    eqSet[i++] = eq;

    // add entries of equation
    for (const HighsSliceNonzero& nonz : getRowVector(eq)) {
      matrix.value_.push_back(nonz.value());
      matrix.index_.push_back(nonz.index());
    }

    // add entry for artificial rhs column
    if (model->row_lower_[eq] != 0.0) {
      matrix.value_.push_back(model->row_lower_[eq]);
      matrix.index_.push_back(model->num_col_);
    }

    matrix.start_[i] = matrix.value_.size();
  }
  std::vector<HighsInt> colSet(matrix.num_col_);
  std::iota(colSet.begin(), colSet.end(), 0);
  HFactor factor;
  factor.setup(matrix, colSet);
  // Set up a time limit to prevent the redundant rows factorization
  // taking forever.
  //
  // Allow no more than 1% of the time limit to be spent on removing
  // dependent equations, but ensure that there is some limit since
  // options->time_limit is infinity by default
  //
  // ToDo: This is strictly non-deterministic, but so conservative
  // that it'll only reap the cases when factor.build never finishes
  const double time_limit =
      std::max(1.0, std::min(0.01 * options->time_limit, 1000.0));
  factor.setTimeLimit(time_limit);
  // Determine rank deficiency of the equations
  highsLogUser(options->log_options, HighsLogType::kInfo,
               "Dependent equations search running on %d equations with time "
               "limit of %.2fs\n",
               static_cast<int>(matrix.num_col_), time_limit);
  double time_taken = -this->timer->read();
  HighsInt build_return = factor.build();
  time_taken += this->timer->read();
  if (build_return == kBuildKernelReturnTimeout) {
    // HFactor::build has timed out, so just return
    highsLogUser(options->log_options, HighsLogType::kInfo,
                 "Dependent equations search terminated after %.3gs due to "
                 "expected time exceeding limit\n",
                 time_taken);
    analysis_.logging_on_ = logging_on;
    if (logging_on)
      analysis_.stopPresolveRuleLog(kPresolveRuleDependentFreeCols);
    return Result::kOk;
  } else {
    double pct_off_timeout =
        1e2 * std::fabs(time_taken - time_limit) / time_limit;
    if (pct_off_timeout < 1.0)
      highsLogUser(options->log_options, HighsLogType::kWarning,
                   "Dependent equations search finished within %.2f%% of limit "
                   "of %.2fs: "
                   "risk of non-deterministic behaviour if solve is repeated\n",
                   pct_off_timeout, time_limit);
  }
  // build_return as rank_deficiency must be valid
  assert(build_return >= 0);
  const HighsInt rank_deficiency = build_return;
  // Analyse what's been removed
  HighsInt num_removed_row = 0;
  HighsInt num_removed_nz = 0;
  HighsInt num_fictitious_rows_skipped = 0;
  for (HighsInt k = 0; k < rank_deficiency; k++) {
    if (factor.var_with_no_pivot[k] >= 0) {
      HighsInt redundant_row = eqSet[factor.var_with_no_pivot[k]];
      num_removed_row++;
      num_removed_nz += rowsize[redundant_row];
      postsolve_stack.redundantRow(redundant_row);
      removeRow(redundant_row);
    } else {
      num_fictitious_rows_skipped++;
    }
  }
  highsLogUser(options->log_options, HighsLogType::kInfo,
               "Dependent equations search removed %d rows and %d nonzeros "
               "in %.2fs (limit = %.2fs)\n",
               static_cast<int>(num_removed_row),
               static_cast<int>(num_removed_nz), time_taken, time_limit);
  if (num_fictitious_rows_skipped)
    highsLogDev(options->log_options, HighsLogType::kInfo,
                ", avoiding %d fictitious rows",
                static_cast<int>(num_fictitious_rows_skipped));
  highsLogDev(options->log_options, HighsLogType::kInfo, "\n");

  analysis_.logging_on_ = logging_on;
  if (logging_on)
    analysis_.stopPresolveRuleLog(kPresolveRuleDependentEquations);
  return Result::kOk;
}